

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void instruct_br(Proc *proc,Pseudo *pseudo,uint line_number)

{
  _Bool _Var1;
  BasicBlock *bb_to_start;
  Instruction *insn_00;
  Instruction *insn;
  uint line_number_local;
  Pseudo *pseudo_local;
  Proc *proc_local;
  
  if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xa) {
    __assert_fail("pseudo->type == PSEUDO_BLOCK",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                  ,0x399,"void instruct_br(Proc *, Pseudo *, unsigned int)");
  }
  _Var1 = is_block_terminated(proc->current_bb);
  if (_Var1) {
    bb_to_start = create_block(proc);
    start_block(proc,bb_to_start,line_number);
  }
  insn_00 = allocate_instruction(proc,op_br,line_number);
  add_instruction_target(proc,insn_00,pseudo);
  add_instruction(proc,insn_00);
  return;
}

Assistant:

static void instruct_br(Proc *proc, Pseudo *pseudo, unsigned line_number)
{
	assert(pseudo->type == PSEUDO_BLOCK);
	if (is_block_terminated(proc->current_bb)) {
		start_block(proc, create_block(proc), line_number);
	}
	Instruction *insn = allocate_instruction(proc, op_br, line_number);
	add_instruction_target(proc, insn, pseudo);
	add_instruction(proc, insn);
}